

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O0

void __thiscall YacclabTests::BlockSizeTest(YacclabTests *this)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  GlobalConfig *pGVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  reference pvVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  size_type sVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  Labeling *pLVar14;
  undefined4 extraout_var;
  reference pvVar15;
  uint *puVar16;
  reference pvVar17;
  double *pdVar18;
  reference pvVar19;
  reference pvVar20;
  reference pbVar21;
  ostream *poVar22;
  ulong uVar23;
  double dVar24;
  double local_9b8;
  int local_8a4;
  int local_8a0;
  int d_2;
  int k_4;
  int dim_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dataset;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  int k_3;
  int d_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *kernel_1;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  path local_830;
  path local_810;
  path local_7f0;
  ostream local_7d0 [8];
  ofstream os;
  int local_5d0;
  int local_5cc;
  int alg_2;
  int k_2;
  reference local_5c0;
  value_type *kernel;
  int k_1;
  exception *e;
  uint it;
  undefined1 local_518 [8];
  vector<double,_std::allocator<double>_> min_times;
  uint dim;
  Labeling *algorithm;
  string algo_name_1;
  uint local_4cc;
  string local_4c8 [4];
  uint alg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8 [32];
  path local_488;
  path local_468;
  undefined1 local_448 [8];
  path filename_path;
  string filename;
  uint local_408;
  uint file;
  uint filenames_size;
  string local_3e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0 [32];
  undefined1 local_3a0 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  filenames;
  path local_380;
  string local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [32];
  path local_320;
  undefined1 local_300 [8];
  path current_latex_path;
  undefined1 local_2c0 [8];
  path is_path;
  undefined1 local_280 [8];
  path dataset_path;
  string dataset_name;
  uint local_23c;
  double dStack_238;
  uint d;
  int local_22c;
  int local_228;
  int local_224;
  undefined1 local_220 [4];
  int k;
  vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_> tmp;
  int alg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *kernels;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *algo_name;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  header;
  vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  results;
  int local_19c;
  int local_198;
  int z;
  int y;
  int x;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> dims;
  int maxsize;
  path local_150;
  path local_130;
  undefined1 local_110 [8];
  path current_output_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  undefined1 local_c0 [8];
  OutputBox ob;
  YacclabTests *this_local;
  
  ob.pb._120_8_ = this;
  std::operator+(local_e0,(char *)this->mode_cfg_);
  OutputBox::OutputBox((OutputBox *)local_c0,local_e0,0x50,2);
  std::__cxx11::string::~string((string *)local_e0);
  filesystem::operator/
            (&local_130,&this->glob_cfg_->glob_output_path,&this->mode_cfg_->mode_output_path);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&maxsize,"Blocksize",
             (allocator *)
             ((long)&dims.
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  filesystem::path::path(&local_150,(string *)&maxsize);
  filesystem::operator/((path *)local_110,&local_130,&local_150);
  filesystem::path::~path(&local_150);
  std::__cxx11::string::~string((string *)&maxsize);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&dims.
                     super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  filesystem::path::~path(&local_130);
  dims.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&y);
  pvVar8 = std::array<int,_3UL>::operator[](&this->mode_cfg_->blocksize_x,0);
  for (z = *pvVar8; pvVar8 = std::array<int,_3UL>::operator[](&this->mode_cfg_->blocksize_x,1),
      z <= *pvVar8; z = *pvVar8 + z) {
    pvVar8 = std::array<int,_3UL>::operator[](&this->mode_cfg_->blocksize_y,0);
    for (local_198 = *pvVar8;
        pvVar8 = std::array<int,_3UL>::operator[](&this->mode_cfg_->blocksize_y,1),
        local_198 <= *pvVar8; local_198 = *pvVar8 + local_198) {
      pvVar8 = std::array<int,_3UL>::operator[](&this->mode_cfg_->blocksize_z,0);
      for (local_19c = *pvVar8;
          pvVar8 = std::array<int,_3UL>::operator[](&this->mode_cfg_->blocksize_z,1),
          local_19c <= *pvVar8; local_19c = *pvVar8 + local_19c) {
        if (z * local_198 * local_19c <=
            (int)dims.
                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage) {
          results.
          super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = z;
          results.
          super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_198;
          std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::push_back
                    ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&y,
                     (value_type *)
                     &results.
                      super__Vector_base<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        pvVar8 = std::array<int,_3UL>::operator[](&this->mode_cfg_->blocksize_z,2);
      }
      pvVar8 = std::array<int,_3UL>::operator[](&this->mode_cfg_->blocksize_y,2);
    }
    pvVar8 = std::array<int,_3UL>::operator[](&this->mode_cfg_->blocksize_x,2);
  }
  std::
  vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  ::vector((vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
            *)&header.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)&__range1);
  pvVar9 = &this->mode_cfg_->ccl_blocksize_algorithms;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar9);
  algo_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(pvVar9);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&algo_name), bVar5) {
    pbVar21 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
    pvVar9 = KernelMapSingleton::GetKernels(pbVar21);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&__range1,pvVar9);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  for (tmp.super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uVar23 = (ulong)tmp.super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this->mode_cfg_->ccl_blocksize_algorithms), uVar23 < sVar10;
      tmp.super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           tmp.super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>::vector
              ((vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_> *)local_220);
    local_224 = 0;
    while( true ) {
      uVar23 = (ulong)local_224;
      pvVar11 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)&__range1,
                             (long)tmp.
                                   super__Vector_base<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(pvVar11);
      if (sVar10 <= uVar23) break;
      sVar10 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                         ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&y
                         );
      local_228 = (int)sVar10;
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this->mode_cfg_->average_datasets);
      local_22c = (int)sVar10;
      dStack_238 = 0.0;
      std::vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>>::emplace_back<int,int,double>
                ((vector<cv::Mat_<double>,std::allocator<cv::Mat_<double>>> *)local_220,&local_228,
                 &local_22c,&stack0xfffffffffffffdc8);
      local_224 = local_224 + 1;
    }
    std::
    vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
    ::push_back((vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
                 *)&header.
                    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_220);
    std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>::~vector
              ((vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_> *)local_220);
  }
  for (local_23c = 0;
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this->mode_cfg_->blocksize_datasets), local_23c < sVar10;
      local_23c = local_23c + 1) {
    pvVar12 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->mode_cfg_->blocksize_datasets,(ulong)local_23c);
    std::__cxx11::string::string((string *)&dataset_path.field_0x18,(string *)pvVar12);
    pGVar4 = this->glob_cfg_;
    filesystem::path::path((path *)&is_path.field_0x18,(string *)&dataset_path.field_0x18);
    filesystem::operator/((path *)local_280,&pGVar4->input_path,(path *)&is_path.field_0x18);
    filesystem::path::~path((path *)&is_path.field_0x18);
    filesystem::path::path((path *)&current_latex_path.field_0x18,&this->glob_cfg_->input_txt);
    filesystem::operator/
              ((path *)local_2c0,(path *)local_280,(path *)&current_latex_path.field_0x18);
    filesystem::path::~path((path *)&current_latex_path.field_0x18);
    filesystem::operator/
              (&local_320,&this->glob_cfg_->glob_output_path,&this->mode_cfg_->mode_output_path);
    filesystem::operator/((path *)local_300,&local_320,&this->glob_cfg_->latex_path);
    filesystem::path::~path(&local_320);
    bVar5 = filesystem::create_directories((path *)local_110);
    if (bVar5) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                *)local_3a0);
      bVar5 = LoadFileList(this,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                 *)local_3a0,(path *)local_2c0);
      if (bVar5) {
        sVar10 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                         *)local_3a0);
        OutputBox::StartUnitaryBox
                  ((OutputBox *)local_c0,(string *)&dataset_path.field_0x18,sVar10 & 0xffffffff);
        for (local_408 = 0;
            sVar10 = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                             *)local_3a0), local_408 < sVar10; local_408 = local_408 + 1) {
          OutputBox::UpdateUnitaryBox((OutputBox *)local_c0,local_408);
          pvVar13 = std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                  *)local_3a0,(ulong)local_408);
          std::__cxx11::string::string((string *)&filename_path.field_0x18,(string *)pvVar13);
          filesystem::path::path(&local_468,(string *)&filename_path.field_0x18);
          filesystem::operator/((path *)local_448,(path *)local_280,&local_468);
          filesystem::path::~path(&local_468);
          pvVar12 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&this->mode_cfg_->ccl_blocksize_algorithms,0);
          pLVar14 = LabelingMapSingleton::GetLabeling(pvVar12);
          iVar7 = (*pLVar14->_vptr_Labeling[9])();
          filesystem::path::string_abi_cxx11_(&local_488);
          bVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x20))
                            ((long *)CONCAT44(extraout_var,iVar7),&local_488);
          std::__cxx11::string::~string((string *)&local_488);
          if (((bVar6 ^ 0xff) & 1) == 0) {
            for (local_4cc = 0;
                sVar10 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(&this->mode_cfg_->ccl_blocksize_algorithms), local_4cc < sVar10;
                local_4cc = local_4cc + 1) {
              pvVar12 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](&this->mode_cfg_->ccl_blocksize_algorithms,(ulong)local_4cc);
              std::__cxx11::string::string((string *)&algorithm,(string *)pvVar12);
              pLVar14 = LabelingMapSingleton::GetLabeling((string *)&algorithm);
              for (min_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                  uVar23 = (ulong)min_times.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                  sVar10 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                           ::size((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                   *)&y), uVar23 < sVar10;
                  min_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ =
                       min_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
                pvVar11 = std::
                          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        *)&__range1,(ulong)local_4cc);
                sVar10 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(pvVar11);
                _it = std::numeric_limits<double>::max();
                std::allocator<double>::allocator((allocator<double> *)((long)&e + 7));
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)local_518,sVar10,
                           (value_type_conflict5 *)&it,(allocator<double> *)((long)&e + 7));
                std::allocator<double>::~allocator((allocator<double> *)((long)&e + 7));
                for (e._0_4_ = 0; (uint)e < this->mode_cfg_->blocksize_tests_number;
                    e._0_4_ = (uint)e + 1) {
                  PerformanceEvaluator::reset_counters(&pLVar14->perf_);
                  pvVar15 = std::
                            vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                            operator[]((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                        *)&y,(ulong)min_times.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_);
                  puVar16 = (uint *)std::array<int,_3UL>::operator[](pvVar15,0);
                  uVar2 = *puVar16;
                  pvVar15 = std::
                            vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                            operator[]((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                        *)&y,(ulong)min_times.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_);
                  puVar16 = (uint *)std::array<int,_3UL>::operator[](pvVar15,1);
                  uVar3 = *puVar16;
                  pvVar15 = std::
                            vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                            operator[]((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                        *)&y,(ulong)min_times.
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_);
                  puVar16 = (uint *)std::array<int,_3UL>::operator[](pvVar15,2);
                  (*pLVar14->_vptr_Labeling[0xb])(pLVar14,(ulong)uVar2,(ulong)uVar3,(ulong)*puVar16)
                  ;
                  kernel._0_4_ = 0;
                  while( true ) {
                    uVar23 = (ulong)(int)kernel;
                    pvVar11 = std::
                              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            *)&__range1,(ulong)local_4cc);
                    sVar10 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size(pvVar11);
                    if (sVar10 <= uVar23) break;
                    pvVar11 = std::
                              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            *)&__range1,(ulong)local_4cc);
                    local_5c0 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[](pvVar11,(long)(int)kernel);
                    bVar5 = PerformanceEvaluator::find(&pLVar14->perf_,local_5c0);
                    if (bVar5) {
                      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                                          ((vector<double,_std::allocator<double>_> *)local_518,
                                           (long)(int)kernel);
                      _alg_2 = PerformanceEvaluator::get_total(&pLVar14->perf_,local_5c0);
                      pdVar18 = std::min<double>(pvVar17,(double *)&alg_2);
                      dVar1 = *pdVar18;
                      pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                                          ((vector<double,_std::allocator<double>_> *)local_518,
                                           (long)(int)kernel);
                      *pvVar17 = dVar1;
                    }
                    kernel._0_4_ = (int)kernel + 1;
                  }
                  (*pLVar14->_vptr_Labeling[5])();
                }
                local_5cc = 0;
                while( true ) {
                  pvVar11 = std::
                            vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          *)&__range1,(ulong)local_4cc);
                  sVar10 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size(pvVar11);
                  if (sVar10 <= (ulong)(long)local_5cc) break;
                  pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                                      ((vector<double,_std::allocator<double>_> *)local_518,
                                       (long)local_5cc);
                  dVar1 = *pvVar17;
                  dVar24 = std::numeric_limits<double>::max();
                  if ((dVar1 != dVar24) || (NAN(dVar1) || NAN(dVar24))) {
                    pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                                        ((vector<double,_std::allocator<double>_> *)local_518,
                                         (long)local_5cc);
                    local_9b8 = *pvVar17;
                  }
                  else {
                    local_9b8 = 0.0;
                  }
                  pvVar19 = std::
                            vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
                            ::operator[]((vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
                                          *)&header.
                                             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (ulong)local_4cc);
                  pvVar20 = std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>::
                            operator[](pvVar19,(long)local_5cc);
                  pdVar18 = cv::Mat_<double>::operator()
                                      (pvVar20,min_times.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage.
                                               _4_4_,local_23c);
                  *pdVar18 = local_9b8 + *pdVar18;
                  local_5cc = local_5cc + 1;
                }
                std::vector<double,_std::allocator<double>_>::~vector
                          ((vector<double,_std::allocator<double>_> *)local_518);
              }
              std::__cxx11::string::~string((string *)&algorithm);
            }
            filenames.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          }
          else {
            std::operator+((char *)local_4c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Unable to open \'");
            std::operator+(local_4a8,(char *)local_4c8);
            OutputBox::Cmessage((OutputBox *)local_c0,local_4a8);
            std::__cxx11::string::~string((string *)local_4a8);
            std::__cxx11::string::~string(local_4c8);
            filenames.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x18;
          }
          filesystem::path::~path((path *)local_448);
          std::__cxx11::string::~string((string *)&filename_path.field_0x18);
        }
        OutputBox::StopUnitaryBox((OutputBox *)local_c0);
        filenames.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      else {
        filesystem::path::string_abi_cxx11_((path *)&file);
        std::operator+((char *)local_3e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Unable to open \'");
        std::operator+(local_3c0,(char *)local_3e0);
        OutputBox::Cwarning((OutputBox *)local_c0,local_3c0,(string *)&dataset_path.field_0x18);
        std::__cxx11::string::~string((string *)local_3c0);
        std::__cxx11::string::~string(local_3e0);
        std::__cxx11::string::~string((string *)&file);
        filenames.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x15;
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)local_3a0);
    }
    else {
      filesystem::path::string_abi_cxx11_(&local_380);
      std::operator+((char *)local_360,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Unable to find/create the output path \'");
      std::operator+(local_340,(char *)local_360);
      OutputBox::Cwarning((OutputBox *)local_c0,local_340,(string *)&dataset_path.field_0x18);
      std::__cxx11::string::~string((string *)local_340);
      std::__cxx11::string::~string(local_360);
      std::__cxx11::string::~string((string *)&local_380);
      filenames.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x15;
    }
    filesystem::path::~path((path *)local_300);
    filesystem::path::~path((path *)local_2c0);
    filesystem::path::~path((path *)local_280);
    std::__cxx11::string::~string((string *)&dataset_path.field_0x18);
  }
  for (local_5d0 = 0;
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this->mode_cfg_->ccl_blocksize_algorithms), (ulong)(long)local_5d0 < sVar10;
      local_5d0 = local_5d0 + 1) {
    pvVar12 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->mode_cfg_->ccl_blocksize_algorithms,(long)local_5d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2,
                   (char *)pvVar12);
    filesystem::path::path(&local_830,(string *)&__range2);
    filesystem::operator/(&local_810,(path *)local_110,&local_830);
    filesystem::path::string_abi_cxx11_(&local_7f0);
    std::ofstream::ofstream(local_7d0,(string *)&local_7f0,_S_out);
    std::__cxx11::string::~string((string *)&local_7f0);
    filesystem::path::~path(&local_810);
    filesystem::path::~path(&local_830);
    std::__cxx11::string::~string((string *)&__range2);
    std::operator<<(local_7d0,",,Kernel");
    pvVar11 = std::
              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)&__range1,(long)local_5d0);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar11);
    kernel_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar11);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&kernel_1), bVar5) {
      pbVar21 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
      for (__range3._4_4_ = 0;
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&this->mode_cfg_->blocksize_datasets),
          (ulong)(long)__range3._4_4_ < sVar10; __range3._4_4_ = __range3._4_4_ + 1) {
        poVar22 = std::operator<<(local_7d0,',');
        std::operator<<(poVar22,(string *)pbVar21);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::operator<<(local_7d0,"\nX,Y,Z");
    __range3._0_4_ = 0;
    while( true ) {
      pvVar11 = std::
                vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)&__range1,(long)local_5d0);
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(pvVar11);
      if (sVar10 <= (ulong)(long)(int)__range3) break;
      pvVar9 = &this->mode_cfg_->blocksize_datasets;
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar9);
      dataset = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(pvVar9);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&dataset), bVar5) {
        pbVar21 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end3);
        poVar22 = std::operator<<(local_7d0,',');
        std::operator<<(poVar22,(string *)pbVar21);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      __range3._0_4_ = (int)__range3 + 1;
    }
    std::operator<<(local_7d0,"\n");
    for (d_2 = 0; sVar10 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                           ::size((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                   *)&y), (ulong)(long)d_2 < sVar10; d_2 = d_2 + 1) {
      pvVar15 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                operator[]((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                           &y,(long)d_2);
      pvVar8 = std::array<int,_3UL>::operator[](pvVar15,0);
      poVar22 = (ostream *)std::ostream::operator<<(local_7d0,*pvVar8);
      poVar22 = std::operator<<(poVar22,',');
      pvVar15 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                operator[]((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                           &y,(long)d_2);
      pvVar8 = std::array<int,_3UL>::operator[](pvVar15,1);
      poVar22 = (ostream *)std::ostream::operator<<(poVar22,*pvVar8);
      poVar22 = std::operator<<(poVar22,',');
      pvVar15 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::
                operator[]((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                           &y,(long)d_2);
      pvVar8 = std::array<int,_3UL>::operator[](pvVar15,2);
      std::ostream::operator<<(poVar22,*pvVar8);
      local_8a0 = 0;
      while( true ) {
        pvVar11 = std::
                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&__range1,(long)local_5d0);
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(pvVar11);
        if (sVar10 <= (ulong)(long)local_8a0) break;
        for (local_8a4 = 0;
            sVar10 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(&this->mode_cfg_->blocksize_datasets), (ulong)(long)local_8a4 < sVar10;
            local_8a4 = local_8a4 + 1) {
          poVar22 = std::operator<<(local_7d0,',');
          pvVar19 = std::
                    vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
                    ::operator[]((vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
                                  *)&header.
                                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)local_5d0);
          pvVar20 = std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>::operator[]
                              (pvVar19,(long)local_8a0);
          pdVar18 = cv::Mat_<double>::operator()(pvVar20,d_2,local_8a4);
          std::ostream::operator<<(poVar22,*pdVar18);
        }
        local_8a0 = local_8a0 + 1;
      }
      std::operator<<(local_7d0,'\n');
    }
    std::ofstream::~ofstream(local_7d0);
  }
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)&__range1);
  std::
  vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
  ::~vector((vector<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>,_std::allocator<std::vector<cv::Mat_<double>,_std::allocator<cv::Mat_<double>_>_>_>_>
             *)&header.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&y);
  filesystem::path::~path((path *)local_110);
  OutputBox::~OutputBox((OutputBox *)local_c0);
  return;
}

Assistant:

void YacclabTests::BlockSizeTest() {
    OutputBox ob(mode_cfg_.mode + " Block Size Test");

    path current_output_path(glob_cfg_.glob_output_path / mode_cfg_.mode_output_path / path("Blocksize"));

    // Create vector of dims (arrays of three int)
    int maxsize = 0;

#if defined YACCLAB_WITH_CUDA
    cudaDeviceProp prop;
    cudaGetDeviceProperties(&prop, 0);
    maxsize = prop.maxThreadsPerBlock;
#endif

    std::vector<std::array<int, 3>> dims;

    for (int x = mode_cfg_.blocksize_x[0]; x <= mode_cfg_.blocksize_x[1]; x += mode_cfg_.blocksize_x[2]) {
        for (int y = mode_cfg_.blocksize_y[0]; y <= mode_cfg_.blocksize_y[1]; y += mode_cfg_.blocksize_y[2]) {
            for (int z = mode_cfg_.blocksize_z[0]; z <= mode_cfg_.blocksize_z[1]; z += mode_cfg_.blocksize_z[2]) {
                if (x * y * z <= maxsize) {
                    dims.push_back({ x, y, z });
                }
            }
        }
    }

    std::vector<std::vector<cv::Mat1d>> results;					// One dims x datasets matrix for each kernel for each algorithm
    std::vector<std::vector<std::string>> header;					// Kernel names for each algorithm
    for (const auto& algo_name : mode_cfg_.ccl_blocksize_algorithms) {

        const auto& kernels = KernelMapSingleton::GetKernels(algo_name);
        header.push_back(kernels);

    }

    for (int alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {
        std::vector<cv::Mat1d> tmp;

        for (int k = 0; k < header[alg].size(); ++k) {
            tmp.emplace_back(static_cast<int>(dims.size()), static_cast<int>(mode_cfg_.average_datasets.size()), (double)0);
        }

        results.push_back(std::move(tmp));
    }

    for (unsigned d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) { // For every dataset in the average list

        std::string dataset_name(mode_cfg_.blocksize_datasets[d]);

        path dataset_path(glob_cfg_.input_path / path(dataset_name)),
            is_path = dataset_path / path(glob_cfg_.input_txt), // files.txt path
            current_latex_path(glob_cfg_.glob_output_path / mode_cfg_.mode_output_path / glob_cfg_.latex_path);

        if (!create_directories(current_output_path)) {
            ob.Cwarning("Unable to find/create the output path '" + current_output_path.string() + "', skipped", dataset_name);
            continue;
        }

        // To save list of filename on which CLLAlgorithms must be tested
        std::vector<std::pair<std::string, bool>> filenames;  // first: filename, second: state of filename (find or not)
        if (!LoadFileList(filenames, is_path)) {
            ob.Cwarning("Unable to open '" + is_path.string() + "', skipped", dataset_name);
            continue;
        }

        // Number of files
        unsigned filenames_size = static_cast<unsigned>(filenames.size());

        // Start output message box
        ob.StartUnitaryBox(dataset_name, filenames_size);

        for (unsigned file = 0; file < filenames.size(); ++file) {

            ob.UpdateUnitaryBox(file);

            std::string filename = filenames[file].first;
            path filename_path = dataset_path / path(filename);

            // Read and load image
            if (!LabelingMapSingleton::GetLabeling(mode_cfg_.ccl_blocksize_algorithms[0])->GetInput()->ReadBinary(filename_path.string())) {
                ob.Cmessage("Unable to open '" + filename + "', skipped");
                continue;
            }

            for (unsigned alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {

                std::string algo_name = mode_cfg_.ccl_blocksize_algorithms[alg];

                Labeling* algorithm = LabelingMapSingleton::GetLabeling(algo_name);

                for (unsigned dim = 0; dim < dims.size(); ++dim) {

                    std::vector<double> min_times(header[alg].size(), std::numeric_limits<double>::max());

                    for (unsigned it = 0; it < mode_cfg_.blocksize_tests_number; ++it) {

                        try {
                            // Perform current algorithm on current image and save result.
                            algorithm->perf_.reset_counters();
                            algorithm->PerformLabelingBlocksize(dims[dim][0], dims[dim][1], dims[dim][2]);
                        }
                        catch (const std::exception& e) {
                            algorithm->FreeLabelingData();
                            ob.Cerror("Something wrong with " + algo_name + ": " + e.what()); // You should check your algorithms' implementation before performing YACCLAB tests  
                        }

                        for (int k = 0; k < header[alg].size(); ++k) {
                            const auto& kernel = header[alg][k];

                            if (algorithm->perf_.find(kernel)) {
                                min_times[k] = std::min(min_times[k], algorithm->perf_.get_total(kernel));
                            }
                        }

                        algorithm->FreeLabelingData();
                    }

                    // For each image, execution times are summed, in order to find average
                    for (int k = 0; k < header[alg].size(); ++k) {
                        // If min time is DBL_MAX, the kernel was never run
                        results[alg][k](dim, d) += (min_times[k] == std::numeric_limits<double>::max() ? 0 : min_times[k]);
                    }

                }

            }

        } // END IMAGE FOR
        ob.StopUnitaryBox();

        // TODO: decide if values should be averaged (they are just summed for now)
        //for (auto& result_mat : results) {
        //	result_mat /= static_cast<double>(filenames.size());
        //}

    } // END DATASET FOR

    
    // Print results
    for (int alg = 0; alg < mode_cfg_.ccl_blocksize_algorithms.size(); ++alg) {

        {   // To automatically destroy ofstream os

            std::ofstream os((current_output_path / path(mode_cfg_.ccl_blocksize_algorithms[alg] + ".csv")).string());

            os << ",,Kernel";
            for (const auto& kernel : header[alg]) {
                for (int d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) {
                    os << ',' << kernel;
                }
            }
            os << "\nX,Y,Z";

            for (int k = 0; k < header[alg].size(); ++k) {
                for (const auto& dataset : mode_cfg_.blocksize_datasets) {
                    os << ',' << dataset;
                }
            }
            os << "\n";

            for (int dim = 0; dim < dims.size(); ++dim) {
                os << dims[dim][0] << ',' << dims[dim][1] << ',' << dims[dim][2];
                for (int k = 0; k < header[alg].size(); ++k) {
                    for (int d = 0; d < mode_cfg_.blocksize_datasets.size(); ++d) {
                        os << ',' << results[alg][k](dim, d);
                    }
                }
                os << '\n';
            }

        }
    }

}